

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall pugi::xpath_variable::set(xpath_variable *this,char_t *value)

{
  bool bVar1;
  size_t sVar2;
  void *__dest;
  
  if (this->_type == xpath_type_string) {
    sVar2 = strlen(value);
    __dest = (void *)(*(code *)impl::(anonymous_namespace)::
                               xml_memory_management_function_storage<int>::allocate)(sVar2 + 1);
    if (__dest == (void *)0x0) {
      bVar1 = false;
    }
    else {
      memcpy(__dest,value,sVar2 + 1);
      if (*(long *)(this + 1) != 0) {
        (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                  deallocate)();
      }
      *(void **)(this + 1) = __dest;
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

PUGI_IMPL_FN bool xpath_variable::set(const char_t* value)
	{
		if (_type != xpath_type_string) return false;

		impl::xpath_variable_string* var = static_cast<impl::xpath_variable_string*>(this);

		// duplicate string
		size_t size = (impl::strlength(value) + 1) * sizeof(char_t);

		char_t* copy = static_cast<char_t*>(impl::xml_memory::allocate(size));
		if (!copy) return false;

		memcpy(copy, value, size);

		// replace old string
		if (var->value) impl::xml_memory::deallocate(var->value);
		var->value = copy;

		return true;
	}